

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void flag_test(Parameters *params)

{
  size_t sVar1;
  ostream *poVar2;
  uint32_t *vals;
  
  sVar1 = params->items_count;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Will test ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," flags (",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"8 bit proc: ",0xc);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"kB, ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"16 bit proc: ",0xd);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"kB, ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"32-bit proc: ",0xd);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"kB) repeated ",0xd);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," times.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  vals = (uint32_t *)operator_new__(-(ulong)(sVar1 * 4 >> 0x3d != 0) | sVar1 << 5);
  benchmark(vals,params);
  free(vals);
  return;
}

Assistant:

void flag_test(const Parameters& params) {
    const size_t bytes  = params.items_count * sizeof(uint8_t);
    const size_t words  = params.items_count * sizeof(uint16_t);
    const size_t dwords = params.items_count * sizeof(uint32_t);
    std::ostream& out = std::cerr;

    out << "Will test " << params.items_count << " flags (";
    out << "8 bit proc: " << bytes / 1024 << "kB, ";
    out << "16 bit proc: " << words / 1024 << "kB, ";
    out << "32-bit proc: " << dwords / 1024 << "kB) repeated " << params.iterations << " times." << std::endl;

    std::unique_ptr<uint32_t, decltype(&aligned_free)> vals(
        static_cast<uint32_t*>(aligned_malloc(dwords, POSPOPCNT_SIMD_ALIGNMENT)),
        &aligned_free);
        
    benchmark(vals.get(), params);
}